

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void testing::internal::ReportUninterestingCall(CallReaction reaction,string *msg)

{
  string *msg_local;
  CallReaction reaction_local;
  
  if (reaction == kAllow) {
    Log(kInfo,msg,3);
  }
  else if (reaction == kDefault) {
    Log(kWarning,msg,3);
  }
  else {
    Expect(false,(char *)0x0,-1,msg);
  }
  return;
}

Assistant:

void ReportUninterestingCall(CallReaction reaction, const string& msg) {
  switch (reaction) {
    case kAllow:
      Log(kInfo, msg, 3);
      break;
    case kWarn:
      Log(kWarning, msg, 3);
      break;
    default:  // FAIL
      Expect(false, NULL, -1, msg);
  }
}